

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

statement_base * __thiscall
cs::method_struct::translate
          (method_struct *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  ulong uVar1;
  tree_node *ptVar2;
  value_type ptVar3;
  _func_int **pp_Var4;
  element_type *peVar5;
  _Elt_pointer pdVar6;
  _Map_pointer ppptVar7;
  tree_node *ptVar8;
  int iVar9;
  const_reference pptVar10;
  token_base **pptVar11;
  statement_struct *this_00;
  _Elt_pointer pptVar12;
  compile_error *pcVar13;
  internal_error *this_01;
  long lVar14;
  ulong uVar15;
  token_base *ptVar16;
  size_t size;
  long lVar17;
  tree_node *ptVar18;
  string name;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  _Self __tmp;
  allocator_type local_199;
  string local_198;
  undefined1 local_178 [16];
  tree_node local_168;
  tree_node *local_148;
  _Elt_pointer ppsStack_140;
  _Elt_pointer local_138;
  _Map_pointer pppsStack_130;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_128;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_108 [2];
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_58;
  
  pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                       ((raw->
                        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                        )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar3 = *pptVar10;
  local_178._0_8_ = ptVar3[1]._vptr_token_base;
  pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_178);
  if (*pptVar11 == (token_base *)0x0) {
    this_01 = (internal_error *)__cxa_allocate_exception(0x28);
    local_178._0_8_ = &local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Null pointer accessed.","")
    ;
    internal_error::internal_error(this_01,(string *)local_178);
    __cxa_throw(this_01,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_178._0_8_ = ptVar3[1]._vptr_token_base;
  pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_178);
  iVar9 = (*(*pptVar11)->_vptr_token_base[2])();
  if (iVar9 != 4) {
    pcVar13 = (compile_error *)__cxa_allocate_exception(0x28);
    local_178._0_8_ = &local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"Wrong grammar for struct definition, expect <id>","");
    compile_error::compile_error(pcVar13,(string *)local_178);
    __cxa_throw(pcVar13,&compile_error::typeinfo,compile_error::~compile_error);
  }
  local_178._0_8_ = ptVar3[1]._vptr_token_base;
  pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_178);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  pp_Var4 = (*pptVar11)[3]._vptr_token_base;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pp_Var4,(*pptVar11)[3].line_num + (long)pp_Var4);
  local_138 = (_Elt_pointer)0x0;
  pppsStack_130 = (_Map_pointer)0x0;
  local_148 = (tree_node *)0x0;
  ppsStack_140 = (_Elt_pointer)0x0;
  local_168.right = (tree_node *)0x0;
  local_168.data = (token_base *)0x0;
  local_168.root = (tree_node *)0x0;
  local_168.left = (tree_node *)0x0;
  local_178._0_8_ = (tree_node *)0x0;
  local_178._8_8_ = 0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            ((_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_178,0
            );
  peVar5 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_128._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_128._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_128._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_128._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar17 = (long)local_128._M_cur - (long)local_128._M_first;
  lVar14 = lVar17 >> 4;
  uVar1 = lVar14 * -0x3333333333333333 + 1;
  if (uVar1 < 6) {
    local_128._M_cur = local_128._M_cur + 1;
  }
  else {
    if (lVar17 < -0x4f) {
      uVar15 = ~((lVar14 * 0x3333333333333333 - 2U) / 6);
    }
    else {
      uVar15 = uVar1 / 6;
    }
    local_128._M_node = local_128._M_node + uVar15;
    local_128._M_first = *local_128._M_node;
    local_128._M_last = local_128._M_first + 6;
    local_128._M_cur = local_128._M_first + uVar15 * -6 + uVar1;
  }
  local_58._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)local_108,&local_128,&local_58,&local_199);
  translator_type::translate
            (&peVar5->translator,&peVar5->context,local_108,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_178,false);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque(local_108);
  ptVar8 = local_148;
  ptVar18 = local_168.root;
  ptVar2 = local_168.right;
  ptVar16 = local_168.data;
  do {
    if (ptVar18 == ptVar8) {
      pdVar6 = (raw->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppptVar7 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      size = ((long)(pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
             ((long)(pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
             ((((ulong)((long)ppptVar7 -
                       (long)(pdVar6->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(ppptVar7 == (_Map_pointer)0x0)) * 0x40;
      if (size == 5) {
        this_00 = (statement_struct *)statement_base::operator_new((statement_base *)0x130,5);
        pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                             ((raw->
                              super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                              )._M_impl.super__Deque_impl_data._M_start._M_cur,3);
        pdVar6 = (raw->
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar12 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar12 ==
            (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
          pptVar12 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                     )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        statement_struct::statement_struct
                  (this_00,&local_198,(tree_type<cs::token_base_*> *)(*pptVar10 + 1),
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_178,
                   context,pptVar12[-1]);
      }
      else {
        this_00 = (statement_struct *)statement_base::operator_new((statement_base *)0x130,size);
        local_108[0].
        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        pdVar6 = (raw->
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar12 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar12 ==
            (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
          pptVar12 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                     )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        statement_struct::statement_struct
                  (this_00,&local_198,(tree_type<cs::token_base_*> *)local_108,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_178,
                   context,pptVar12[-1]);
        tree_type<cs::token_base_*>::destroy
                  ((tree_node *)
                   local_108[0].
                   super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                ((_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      return &this_00->super_statement_base;
    }
    iVar9 = (*(code *)ptVar18->root->root->right)();
    if (iVar9 != 7) {
      if (iVar9 != 0x17) {
        pcVar13 = (compile_error *)__cxa_allocate_exception(0x28);
        local_108[0].
        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map =
             &local_108[0].
              super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"Unexpected statement in structure definition.","");
        compile_error::compile_error(pcVar13,(string *)local_108);
        __cxa_throw(pcVar13,&compile_error::typeinfo,compile_error::~compile_error);
      }
      statement_function::set_mem_fn((statement_function *)ptVar18->root);
    }
    ptVar18 = (tree_node *)&ptVar18->left;
    if (ptVar18 == ptVar2) {
      ptVar18 = (tree_node *)ptVar16->line_num;
      ptVar16 = (token_base *)&ptVar16->line_num;
      ptVar2 = ptVar18 + 0x10;
    }
  } while( true );
}

Assistant:

statement_base *
	method_struct::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar for struct definition, expect <id>");
		std::string name = static_cast<token_id *>(t.root().data())->get_id();
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		for (auto &ptr: body) {
			try {
				switch (ptr->get_type()) {
				default:
					throw compile_error("Unexpected statement in structure definition.");
				case statement_types::var_:
					break;
				case statement_types::function_:
					static_cast<statement_function *>(ptr)->set_mem_fn();
					break;
				}
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
		}
		if (raw.front().size() == 5)
			return new statement_struct(name, static_cast<token_expr *>(raw.front().at(3))->get_tree(), body, context,
			                            raw.front().back());
		else
			return new statement_struct(name, tree_type<token_base *>(), body, context, raw.front().back());
	}